

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

QString * __thiscall
QTzTimeZonePrivate::comment(QString *__return_storage_ptr__,QTzTimeZonePrivate *this)

{
  Type *this_00;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QTzTimeZone QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)__return_storage_ptr__);
  QHash<QByteArray,_QTzTimeZone>::value(&QStack_38,this_00,&(this->super_QTimeZonePrivate).m_id);
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)QStack_38.comment.d.ptr;
  QString::fromUtf8(__return_storage_ptr__,(QString *)QStack_38.comment.d.size,ba);
  if (&(QStack_38.comment.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((QStack_38.comment.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(QStack_38.comment.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTzTimeZonePrivate::comment() const
{
    return QString::fromUtf8(tzZones->value(m_id).comment);
}